

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcMasterTable.cpp
# Opt level: O1

void __thiscall GrcMasterTable::SetupGlyphAttrs(GrcMasterTable *this)

{
  _Base_ptr this_00;
  GdlGlyphClassDefn *pglfc;
  _Rb_tree_node_base *p_Var1;
  
  for (p_Var1 = (this->m_vlistmapEntries)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->m_vlistmapEntries)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    this_00 = p_Var1[1]._M_parent;
    if (*(long *)(*(long *)(p_Var1 + 1) + 0x68) == 0) {
      pglfc = (GdlGlyphClassDefn *)0x0;
    }
    else {
      pglfc = (GdlGlyphClassDefn *)
              __dynamic_cast(*(long *)(*(long *)(p_Var1 + 1) + 0x68),&GdlDefn::typeinfo,
                             &GdlGlyphClassDefn::typeinfo,0);
    }
    GrcMasterValueList::SetupGlyphAttrs((GrcMasterValueList *)this_00,pglfc);
  }
  return;
}

Assistant:

void GrcMasterTable::SetupGlyphAttrs()
{
	for (ValueListMap::iterator itvlistmap = EntriesBegin();
		itvlistmap != EntriesEnd();
		++itvlistmap)
	{
		Symbol psymClassName = itvlistmap->first;   // GetKey();
		GrcMasterValueList * pmvl = itvlistmap->second;  // GetValue();

		Assert(psymClassName->FitsSymbolType(ksymtClass));

		GdlGlyphClassDefn * pglfc = dynamic_cast<GdlGlyphClassDefn*>(psymClassName->Data());
		Assert(pglfc);

		pmvl->SetupGlyphAttrs(pglfc);
	}
}